

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

Instrument * Timidity::load_instrument_dls(Renderer *song,int drum,int bank,int instrument)

{
  byte *pbVar1;
  int *piVar2;
  uint uVar3;
  ULONG UVar4;
  DLS_Data *pDVar5;
  DLS_Region *pDVar6;
  DLS_Wave *pDVar7;
  ushort *puVar8;
  long lVar9;
  WaveFMT *pWVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Instrument *pIVar18;
  Sample *pSVar19;
  CONNECTIONLIST *pCVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  DLS_Instrument *pDVar26;
  uint uVar27;
  Instrument *pIVar28;
  CONNECTION *artList;
  DLS_Instrument *pDVar29;
  DLS_Instrument *pDVar30;
  Instrument *pIVar31;
  double dVar32;
  
  pDVar5 = song->patches;
  pIVar18 = (Instrument *)0x0;
  if (pDVar5 != (DLS_Data *)0x0) {
    uVar27 = (uint)(drum != 0) * -0x80000000;
    uVar23 = pDVar5->cInstruments;
    pIVar28 = (Instrument *)(ulong)uVar23;
    if (pIVar28 == (Instrument *)0x0) {
      pDVar30 = (DLS_Instrument *)0x0;
    }
    else {
      pDVar29 = pDVar5->instruments;
      pDVar26 = pDVar29 + (uVar23 - 1);
      pIVar31 = (Instrument *)0x0;
      do {
        uVar3 = (pDVar29->header->Locale).ulBank;
        if ((((uVar3 & 0x80000000) == uVar27) && ((uVar3 >> 8 & 0xff) == bank)) &&
           (pDVar30 = pDVar29, pIVar18 = pIVar31,
           (pDVar29->header->Locale).ulInstrument == instrument)) break;
        pIVar31 = (Instrument *)((long)&pIVar31->samples + 1);
        pDVar29 = pDVar29 + 1;
        pDVar30 = pDVar26;
        pIVar18 = pIVar28;
      } while (pIVar28 != pIVar31);
    }
    if ((bank == 0) && ((uint)pIVar18 == uVar23)) {
      if (pIVar28 == (Instrument *)0x0) {
        pIVar18 = (Instrument *)0x0;
      }
      else {
        pDVar29 = pDVar5->instruments;
        pDVar26 = pDVar29 + (uVar23 - 1);
        pIVar31 = (Instrument *)0x0;
        do {
          if ((((pDVar29->header->Locale).ulBank & 0x80000000) == uVar27) &&
             (pDVar30 = pDVar29, pIVar18 = pIVar31,
             (pDVar29->header->Locale).ulInstrument == instrument)) break;
          pIVar31 = (Instrument *)((long)&pIVar31->samples + 1);
          pDVar29 = pDVar29 + 1;
          pDVar30 = pDVar26;
          pIVar18 = pIVar28;
        } while (pIVar28 != pIVar31);
      }
    }
    if ((uint)pIVar18 == uVar23) {
      pIVar18 = (Instrument *)0x0;
    }
    else {
      pIVar18 = (Instrument *)safe_malloc(0x10);
      UVar4 = pDVar30->header->cRegions;
      pIVar18->samples = UVar4;
      pSVar19 = (Sample *)safe_malloc((long)(int)UVar4 * 0x68);
      pIVar18->sample = pSVar19;
      memset(pSVar19,0,(long)pIVar18->samples * 0x68);
      if (pDVar30->header->cRegions != 0) {
        lVar24 = 0x28;
        lVar25 = 0;
        uVar22 = 0;
        do {
          pSVar19 = pIVar18->sample;
          pDVar6 = pDVar30->regions;
          pDVar7 = song->patches->waveList;
          uVar23 = *(uint *)(*(long *)((long)pDVar6 + lVar24 + -0x20) + 8);
          (&pSVar19->type)[lVar25] = '\x01';
          puVar8 = *(ushort **)((long)pDVar6 + lVar24 + -0x28);
          (&pSVar19->self_nonexclusive)[lVar25] = (bool)((byte)puVar8[4] & 1);
          *(short *)((long)&pSVar19->key_group + lVar25) = (short)(char)puVar8[5];
          dVar32 = exp2((double)*puVar8 * 0.08333333333333333);
          *(float *)((long)&pSVar19->low_freq + lVar25) = (float)(dVar32 * 8175.798947309669);
          dVar32 = exp2((double)puVar8[1] * 0.08333333333333333);
          *(float *)((long)&pSVar19->high_freq + lVar25) = (float)(dVar32 * 8175.798947309669);
          lVar9 = *(long *)((long)pDVar6 + lVar24 + -0x18);
          dVar32 = exp2((double)((float)(int)*(short *)(lVar9 + 6) * 0.01 +
                                (float)*(ushort *)(lVar9 + 4)) * 0.08333333333333333);
          *(float *)((long)&pSVar19->root_freq + lVar25) = (float)(dVar32 * 8175.798947309669);
          (&pSVar19->low_vel)[lVar25] = (BYTE)puVar8[2];
          (&pSVar19->high_vel)[lVar25] = (BYTE)puVar8[3];
          pWVar10 = pDVar7[uVar23].format;
          *(ushort *)((long)&pSVar19->modes + lVar25) = (pWVar10->wBitsPerSample == 8) + 1;
          *(DWORD *)((long)&pSVar19->sample_rate + lVar25) = pWVar10->dwSamplesPerSec;
          *(undefined8 *)((long)&pSVar19->data + lVar25) = 0;
          *(DWORD *)((long)&pSVar19->data_length + lVar25) = pDVar7[uVar23].length;
          convert_sample_data((Sample *)((long)&pSVar19->loop_start + lVar25),pDVar7[uVar23].data);
          lVar9 = *(long *)((long)pDVar6 + lVar24 + -0x18);
          if (*(int *)(lVar9 + 0x10) != 0) {
            pbVar1 = (byte *)((long)&pSVar19->modes + lVar25);
            *pbVar1 = *pbVar1 | 0x24;
            lVar11 = *(long *)((long)pDVar6 + lVar24 + -0x10);
            uVar23 = *(uint *)(lVar11 + 8) >> 1;
            *(uint *)((long)&pSVar19->loop_start + lVar25) = uVar23;
            *(uint *)((long)&pSVar19->loop_end + lVar25) = (*(uint *)(lVar11 + 0xc) >> 1) + uVar23;
          }
          *(undefined2 *)((long)&pSVar19->scale_factor + lVar25) = 0x400;
          *(undefined2 *)((long)&pSVar19->scale_note + lVar25) = *(undefined2 *)(lVar9 + 4);
          if ((*(byte *)((long)&pSVar19->modes + lVar25) & 0x20) != 0) {
            pCVar20 = pDVar30->art;
            if (((pCVar20 == (CONNECTIONLIST *)0x0) || (pCVar20->cConnections == 0)) ||
               (artList = pDVar30->artList, artList == (CONNECTION *)0x0)) {
              pCVar20 = *(CONNECTIONLIST **)((long)pDVar6 + lVar24 + -8);
              artList = *(CONNECTION **)((long)&pDVar6->header + lVar24);
            }
            UVar4 = pCVar20->cConnections;
            iVar12 = load_connection(UVar4,artList,0x206);
            iVar13 = load_connection(UVar4,artList,0x20c);
            iVar14 = load_connection(UVar4,artList,0x207);
            iVar15 = load_connection(UVar4,artList,0x209);
            iVar16 = load_connection(UVar4,artList,0x20a);
            iVar17 = load_connection(UVar4,artList,4);
            iVar21 = iVar17 + 0xffff;
            if (-1 < iVar17) {
              iVar21 = iVar17;
            }
            *(short *)((long)&pSVar19->panning + lVar25) =
                 (short)(int)((double)(iVar21 >> 0x10) * 16.383 + 8191.5);
            *(undefined2 *)((long)&pSVar19->envelope + lVar25) = 0x8000;
            *(short *)((long)&pSVar19->envelope + lVar25 + 2) = (short)((uint)iVar12 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar25 + 4) = (short)((uint)iVar13 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar25 + 6) = (short)((uint)iVar14 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar25 + 10) = (short)((uint)iVar15 >> 0x10);
            *(short *)((long)&pSVar19->envelope + lVar25 + 8) = (short)((uint)iVar16 >> 0x10);
          }
          piVar2 = (int *)((long)&pSVar19->data_length + lVar25);
          *piVar2 = *piVar2 << 0xc;
          piVar2 = (int *)((long)&pSVar19->loop_start + lVar25);
          *piVar2 = *piVar2 << 0xc;
          piVar2 = (int *)((long)&pSVar19->loop_end + lVar25);
          *piVar2 = *piVar2 << 0xc;
          uVar22 = uVar22 + 1;
          lVar25 = lVar25 + 0x68;
          lVar24 = lVar24 + 0x30;
        } while (uVar22 < pDVar30->header->cRegions);
      }
    }
  }
  return pIVar18;
}

Assistant:

Instrument *load_instrument_dls(Renderer *song, int drum, int bank, int instrument)
{
	Instrument *inst;
	DWORD i;
	DLS_Instrument *dls_ins = NULL;

	if (song->patches == NULL)
	{
		return NULL;
	}
	drum = drum ? 0x80000000 : 0;
	for (i = 0; i < song->patches->cInstruments; ++i)
	{
		dls_ins = &song->patches->instruments[i];
		if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
			((dls_ins->header->Locale.ulBank >> 8) & 0xFF) == (ULONG)bank &&
			dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
			break;
	}
	if (i == song->patches->cInstruments && bank == 0)
	{
		for (i = 0; i < song->patches->cInstruments; ++i)
		{
			dls_ins = &song->patches->instruments[i];
			if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
				dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
				break;
		}
	}
	if (i == song->patches->cInstruments)
	{
//		SNDDBG(("Couldn't find %s instrument %d in bank %d\n", drum ? "drum" : "melodic", instrument, bank));
		return NULL;
	}

	inst = (Instrument *)safe_malloc(sizeof(Instrument));
	inst->samples = dls_ins->header->cRegions;
	inst->sample = (Sample *)safe_malloc(inst->samples * sizeof(Sample));
	memset(inst->sample, 0, inst->samples * sizeof(Sample));
	/*
	printf("Found %s instrument %d in bank %d named %s with %d regions\n", drum ? "drum" : "melodic", instrument, bank, dls_ins->name, inst->samples);
	*/
	for (i = 0; i < dls_ins->header->cRegions; ++i)
	{
		load_region_dls(song, &inst->sample[i], dls_ins, i);
	}
	return inst;
}